

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cpp
# Opt level: O2

status_t __thiscall libchars::commands::sort(commands *this)

{
  byte *pbVar1;
  uint uVar2;
  undefined1 *puVar3;
  undefined1 auVar4 [8];
  __type _Var5;
  int iVar6;
  token **pptVar7;
  ulong uVar8;
  token *ptVar9;
  token *ptVar10;
  token *ptVar11;
  debug *pdVar12;
  status_t sVar13;
  ulong uVar14;
  uint32_t *puVar15;
  id_t *piVar16;
  long lVar17;
  token **pptVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar19;
  long lVar20;
  bool bVar21;
  double __x;
  double __x_00;
  double __x_01;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x_02;
  undefined1 local_60 [8];
  parameters_t par;
  long local_40;
  
  if (this->cmd == (command *)0x0) {
    return NO_COMMAND;
  }
  std::vector<libchars::parameter,_std::allocator<libchars::parameter>_>::vector
            ((vector<libchars::parameter,_std::allocator<libchars::parameter>_> *)local_60,
             &this->cmd->par);
  lVar20 = 0;
  local_40 = 0;
  pptVar7 = &this->t_par;
  pptVar18 = pptVar7;
  par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pptVar7;
  while (ptVar10 = *pptVar18, ptVar10 != (token *)0x0) {
    if ((ptVar10->status & 0x500) == 0) {
      lVar17 = 0x6c;
      for (uVar14 = 0; auVar4 = local_60,
          pptVar7 = (token **)
                    par.
                    super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
          uVar14 < (ulong)(((long)par.
                                  super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                                  ._M_impl.super__Vector_impl_data._M_start - (long)local_60) / 0x90
                          ); uVar14 = uVar14 + 1) {
        if (((*(byte *)((long)&(((token *)local_60)->value)._M_dataplus._M_p + lVar17 + 1) & 1) == 0
            ) && (*(int *)((long)local_60 + lVar17 + -0x2c) == 4)) {
          pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)local_60 + lVar17 + -0x4c);
          _Var5 = std::operator==(pbVar19,&ptVar10->value);
          if (_Var5) {
            ptVar10->status = ptVar10->status | 0x110;
            ptVar10->ttype = FLAG;
            std::__cxx11::string::_M_assign((string *)&ptVar10->name);
            ptVar10->ID = *(id_t *)((long)auVar4 + lVar17 + -4);
            (ptVar10->value)._M_string_length = 0;
            *(ptVar10->value)._M_dataplus._M_p = '\0';
            pbVar1 = (byte *)((long)&(((token *)auVar4)->value)._M_dataplus._M_p + lVar17 + 1);
            *pbVar1 = *pbVar1 | 1;
            local_40 = local_40 + 1;
            pptVar7 = (token **)
                      par.
                      super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
            break;
          }
          iVar6 = std::__cxx11::string::compare
                            ((ulong)pbVar19,0,(string *)(ptVar10->value)._M_string_length);
          if (iVar6 == 0) {
            *(byte *)&ptVar10->status = (byte)ptVar10->status | 4;
          }
        }
        lVar17 = lVar17 + 0x90;
      }
    }
    lVar20 = lVar20 + 1;
    pptVar18 = &ptVar10->next;
  }
  while (ptVar10 = *pptVar7, ptVar10 != (token *)0x0) {
    if ((ptVar10->status & 0x500) == 0) {
      lVar17 = 0x20;
      for (uVar14 = 0; auVar4 = local_60,
          uVar14 < (ulong)(((long)par.
                                  super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                                  ._M_impl.super__Vector_impl_data._M_start - (long)local_60) / 0x90
                          ); uVar14 = uVar14 + 1) {
        if (((*(byte *)((long)&(((token *)local_60)->help)._M_dataplus._M_p + lVar17 + 5) & 1) == 0)
           && (*(int *)((long)&(((token *)local_60)->name)._M_dataplus._M_p + lVar17) == 2)) {
          pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)&(((token *)local_60)->value)._M_dataplus._M_p + lVar17);
          _Var5 = std::operator==(pbVar19,&ptVar10->value);
          if (_Var5) {
            ptVar10->status = ptVar10->status & 0xfffffeeb | 0x110;
            ptVar10->ttype = KEY;
            std::__cxx11::string::_M_assign((string *)&ptVar10->name);
            ptVar10->ID = *(id_t *)((long)&(((token *)auVar4)->help)._M_dataplus._M_p + lVar17);
            if (ptVar10->next == (token *)0x0) {
              pdVar12 = debug::initialize(0);
              __x_02 = extraout_XMM0_Qa;
            }
            else {
              if ((ptVar10->next->status & 0x100) == 0) {
                (ptVar10->value)._M_string_length = 0;
                *(ptVar10->value)._M_dataplus._M_p = '\0';
                ptVar10 = ptVar10->next;
                ptVar10->status = ptVar10->status | 0x910;
                ptVar10->ttype = KEY;
                std::__cxx11::string::_M_assign((string *)&ptVar10->name);
                ptVar10->ID = *(id_t *)((long)&(((token *)auVar4)->help)._M_dataplus._M_p + lVar17);
                ptVar10->vtype =
                     *(id_t *)((long)&(((token *)auVar4)->help)._M_string_length + lVar17);
                pbVar1 = (byte *)((long)&(((token *)auVar4)->help)._M_dataplus._M_p + lVar17 + 5);
                *pbVar1 = *pbVar1 | 1;
                local_40 = local_40 + 2;
                break;
              }
              pdVar12 = debug::initialize(0);
              __x_02 = extraout_XMM0_Qa_00;
            }
            sVar13 = MISSING_VALUE;
            debug::log(pdVar12,__x_02);
            (ptVar10->value)._M_string_length = 0;
            *(ptVar10->value)._M_dataplus._M_p = '\0';
            goto LAB_00115a46;
          }
          iVar6 = std::__cxx11::string::compare
                            ((ulong)pbVar19,0,(string *)(ptVar10->value)._M_string_length);
          if (iVar6 == 0) {
            *(byte *)&ptVar10->status = (byte)ptVar10->status | 4;
          }
        }
        lVar17 = lVar17 + 0x90;
      }
    }
    pptVar7 = &ptVar10->next;
  }
  uVar8 = ((long)par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                 _M_impl.super__Vector_impl_data._M_start - (long)local_60) / 0x90;
  puVar15 = &((token *)local_60)->status;
  lVar17 = 0;
  uVar14 = uVar8;
  while (bVar21 = uVar14 != 0, uVar14 = uVar14 - 1, bVar21) {
    if (puVar15[-0xb] == VALUE) {
      lVar17 = lVar17 + (ulong)((*puVar15 >> 0xc & 1) != 0);
    }
    else if ((puVar15[-0xb] == KEY) && ((*puVar15 & 0x1100) == 0x1000)) {
      pdVar12 = debug::initialize(0);
      debug::log(pdVar12,__x_01);
      goto LAB_00115876;
    }
    puVar15 = puVar15 + 0x24;
  }
  lVar20 = lVar20 - local_40;
  ptVar10 = (token *)((par.
                       super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).value.
                     _M_dataplus._M_p;
  uVar14 = 0;
  ptVar11 = ptVar10;
  while( true ) {
    bVar21 = lVar20 != 0;
    lVar20 = lVar20 + -1;
    ptVar9 = ptVar10;
    if ((!bVar21) || (ptVar11 == (token *)0x0)) break;
    while( true ) {
      bVar21 = true;
      if (ptVar11 == (token *)0x0) goto LAB_00115786;
      if ((ptVar11->status >> 8 & 1) == 0) break;
      ptVar11 = ptVar11->next;
    }
    piVar16 = &(((pointer)((long)local_60 + uVar14 * 0x90))->super_token).vtype;
    while( true ) {
      if (uVar8 <= uVar14) goto LAB_00115786;
      if (((*piVar16 & 0x10000000000) == 0) && (piVar16[-0xc] == VALUE)) break;
      uVar14 = uVar14 + 1;
      piVar16 = piVar16 + 0x24;
    }
    ptVar11->status = ptVar11->status | 0x910;
    ptVar11->ttype = VALUE;
    ptVar11->vtype = *piVar16;
    ptVar11->ID = piVar16[-2];
    uVar2 = piVar16[-1];
    piVar16[-1] = uVar2 | 0x100;
    lVar17 = lVar17 + ((int)(uVar2 << 0x13) >> 0x1f);
  }
LAB_00115786:
  do {
    if (ptVar9 == (token *)0x0) break;
    while( true ) {
      if (ptVar9 == (token *)0x0) goto LAB_001157c4;
      uVar2 = ptVar9->status;
      if ((uVar2 >> 8 & 1) == 0) break;
      ptVar9 = ptVar9->next;
    }
    ptVar9->status = (uint)((uVar2 & 4) == 0) * 2 | uVar2 | 0x110;
    ptVar9->ttype = UNKNOWN;
  } while( true );
LAB_001157c4:
  if (bVar21) {
    pdVar12 = debug::initialize(0);
    debug::log(pdVar12,__x);
    sVar13 = TOO_MANY_ARGS;
  }
  else if (lVar17 == 0) {
    if (ptVar10 == (token *)0x0) {
      ptVar10 = this->t_cmd;
    }
    do {
      ptVar11 = ptVar10;
      if (ptVar11 == (token *)0x0) goto LAB_001159f1;
      ptVar10 = ptVar11->next;
    } while (ptVar11->next != (token *)0x0);
    lVar20 = 0;
    for (uVar14 = 0; auVar4 = local_60,
        uVar14 < (ulong)(((long)par.
                                super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                                ._M_impl.super__Vector_impl_data._M_start - (long)local_60) / 0x90);
        uVar14 = uVar14 + 1) {
      if ((*(uint *)((long)&((token *)local_60)->status + lVar20) & 0x8100) == 0x8000) {
        iVar6 = *(int *)((long)&((token *)local_60)->ttype + lVar20);
        if (iVar6 == 2) {
          ptVar10 = (token *)operator_new(0x90);
          token::token(ptVar10,*(type_t *)((long)&((token *)auVar4)->ttype + lVar20),
                       *(id_t *)((long)&((token *)auVar4)->ID + lVar20),
                       *(id_t *)((long)&((token *)auVar4)->vtype + lVar20),
                       *(char **)((long)&(((token *)auVar4)->name)._M_dataplus._M_p + lVar20));
          puVar3 = (undefined1 *)((long)&ptVar10->status + 1);
          *puVar3 = *puVar3 | 1;
          ptVar11->next = ptVar10;
          if (((par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).value._M_dataplus.
              _M_p == (pointer)0x0) {
            ((par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).value._M_dataplus.
            _M_p = (pointer)ptVar10;
          }
          ptVar11 = (token *)operator_new(0x90);
          token::token(ptVar11,*(type_t *)((long)&((token *)auVar4)->ttype + lVar20),
                       *(id_t *)((long)&((token *)auVar4)->ID + lVar20),
                       *(id_t *)((long)&((token *)auVar4)->vtype + lVar20),
                       *(char **)((long)&(((token *)auVar4)->name)._M_dataplus._M_p + lVar20));
          pbVar1 = (byte *)((long)&ptVar11->status + 1);
          *pbVar1 = *pbVar1 | 0x49;
          std::__cxx11::string::_M_assign((string *)ptVar11);
          ptVar10->next = ptVar11;
        }
        else if (iVar6 == 3) {
          ptVar10 = (token *)operator_new(0x90);
          token::token(ptVar10,*(type_t *)((long)&((token *)auVar4)->ttype + lVar20),
                       *(id_t *)((long)&((token *)auVar4)->ID + lVar20),
                       *(id_t *)((long)&((token *)auVar4)->vtype + lVar20),(char *)0x0);
          puVar3 = (undefined1 *)((long)&ptVar10->status + 1);
          *puVar3 = *puVar3 | 0x41;
          std::__cxx11::string::_M_assign((string *)ptVar10);
          ptVar11->next = ptVar10;
          ptVar11 = ptVar10;
          if (((par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).value._M_dataplus.
              _M_p == (pointer)0x0) {
            ((par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).value._M_dataplus.
            _M_p = (pointer)ptVar10;
          }
        }
      }
      lVar20 = lVar20 + 0x90;
    }
LAB_001159f1:
    sVar13 = VALID_COMMAND;
  }
  else {
    pdVar12 = debug::initialize(0);
    debug::log(pdVar12,__x_00);
LAB_00115876:
    sVar13 = TOO_FEW_ARGS;
  }
LAB_00115a46:
  std::vector<libchars::parameter,_std::allocator<libchars::parameter>_>::~vector
            ((vector<libchars::parameter,_std::allocator<libchars::parameter>_> *)local_60);
  return sVar13;
}

Assistant:

commands::status_t commands::sort()
    {
        if (cmd == NULL)
            return NO_COMMAND;

        size_t p_idx = 0;
        size_t n_assigned = 0;
        size_t n_available = 0;
        token *T = NULL;
        parameters_t par = cmd->par;

        // find FLAG parameters
        T = t_par;
        while (T != NULL) {
            ++n_available;
            if ((T->status & (token::IS_QUOTED | token::SORTED)) == 0) {
                for (p_idx = 0; p_idx < par.size(); ++p_idx) {
                    parameter &P = par[p_idx];
                    if (!(P.status & token::SORTED) && P.ttype == token::FLAG) {
                        if (P.name == T->value) {
                            // full match on flag name
                            T->status |= (token::SORTED | token::IN_STRING);
                            T->ttype = token::FLAG;
                            T->name = P.name;
                            T->ID = P.ID;
                            T->value.clear();
                            P.status |= token::SORTED;
                            ++n_assigned;
                            break;
                        }
                        else if (P.name.compare(0, T->value.length(), T->value) == 0) {
                            // partial match on flag name
                            T->status |= token::PARTIAL_ARG;
                        }
                    }
                }
            }
            T = T->next;
        }

        // find values for KEY parameters; error if corresponding value not available
        T = t_par;
        while (T != NULL) {
            if ((T->status & (token::IS_QUOTED | token::SORTED)) == 0) {
                for (p_idx = 0; p_idx < par.size(); ++p_idx) {
                    parameter &P = par[p_idx];
                    if (!(P.status & token::SORTED) && P.ttype == token::KEY) {
                        if (P.name == T->value) {
                            // full match on key name
                            T->status &= ~token::PARTIAL_ARG;
                            T->status |= (token::SORTED | token::IN_STRING);
                            T->ttype = token::KEY;
                            T->name = P.name;
                            T->ID = P.ID;
                            if (T->next == NULL) {
                                LC_LOG_VERBOSE("KEY(%s): missing value", P.name.c_str());
                                T->value.clear();
                                return MISSING_VALUE;
                            }
                            else if (T->next->status & token::SORTED) {
                                LC_LOG_VERBOSE("KEY(%s): missing value", P.name.c_str());
                                T->value.clear();
                                return MISSING_VALUE;
                            }
                            else {
                                T->value.clear();
                                T = T->next;
                                T->status |= (token::SORTED | token::IN_STRING | token::IS_VALUE);
                                T->ttype = token::KEY;
                                T->name = P.name;
                                T->ID = P.ID;
                                T->vtype = P.vtype;
                                P.status |= token::SORTED;
                                n_assigned += 2;
                                break;
                            }
                        }
                        else if (P.name.compare(0, T->value.length(), T->value) == 0) {
                            // partial match on key name
                            T->status |= token::PARTIAL_ARG;
                        }
                    }
                }
            }
            T = T->next;
        }

        // make sure all mandatory KEY parameters were specified
        size_t n_pm = 0, n_po = 0;
        for (p_idx = 0; p_idx < par.size(); ++p_idx) {
            parameter &P = par[p_idx];
            switch (P.ttype) {
            case token::KEY:
                if ((P.status & (token::SORTED | token::MANDATORY)) == token::MANDATORY) {
                    LC_LOG_VERBOSE("KEY(%s): missing key", P.name.c_str());
                    return TOO_FEW_ARGS;
                }
                break;
            case token::VALUE:
                if (P.status & token::MANDATORY) {
                    ++n_pm;
                }
                else {
                    ++n_po;
                }
                break;
            default:;
            }
        }

        // extract positional arguments (type = VALUE)
        size_t n_arguments = n_available - n_assigned;
        p_idx = 0;
        T = t_par;
        while (n_arguments > 0 && T != NULL) {
            while (T != NULL && (T->status & token::SORTED))
                T = T->next;
            if (T == NULL)
                break;
            while (p_idx < par.size() && ((par[p_idx].status & token::SORTED) || par[p_idx].ttype != token::VALUE))
                ++p_idx;
            if (p_idx >= par.size())
                break;
            parameter& P = par[p_idx];
            T->status |= (token::SORTED | token::IN_STRING | token::IS_VALUE);
            T->ttype = token::VALUE;
            T->vtype = P.vtype;
            T->ID = P.ID;
            P.status |= token::SORTED;
            --n_arguments;
            if (P.status & token::MANDATORY) --n_pm; else --n_po;
        }

        // mark remaining arguments as invalid (if not a partial key match)
        T = t_par;
        while (T != NULL) {
            while (T != NULL && (T->status & token::SORTED))
                T = T->next;
            if (T == NULL)
                break;
            T->status |= (token::SORTED | token::IN_STRING);
            if (!(T->status & token::PARTIAL_ARG))
                T->status |= token::INVALID;
            T->ttype = token::UNKNOWN;
        }

        if (n_arguments > 0) {
            LC_LOG_VERBOSE("Too many arguments [%zu extra]",n_arguments);
            return TOO_MANY_ARGS;
        }
        else if (n_pm > 0) {
            LC_LOG_VERBOSE("Missing mandatory arguments [%zu remain]",n_pm);
            return TOO_FEW_ARGS;
        }

        // add unspecified optional parameters (with default values) to token list
        token *t_head = (t_par != NULL) ? t_par : t_cmd;
        while (t_head != NULL && t_head->next != NULL)
            t_head = t_head->next;

        if (t_head != NULL) {
            for (p_idx = 0; p_idx < par.size(); ++p_idx) {
                parameter &P = par[p_idx];
                if ((P.status & (token::SORTED | token::DEFAULT_SET)) == token::DEFAULT_SET) {
                    switch (P.ttype) {
                    case token::FLAG:
                        // missing flag = FALSE
                        break;
                    case token::VALUE:
                        T = new token(P.ttype,P.ID,P.vtype);
                        T->status |= (token::SORTED | token::DEFAULT_USED);
                        T->value = P.value;
                        t_head->next = T;
                        t_head = T;
                        if (t_par == NULL)
                            t_par = T;
                        break;
                    case token::KEY:
                        T = new token(P.ttype,P.ID,P.vtype,P.name.c_str());
                        T->status |= (token::SORTED);
                        t_head->next = T;
                        t_head = T;
                        if (t_par == NULL)
                            t_par = T;
                        T = new token(P.ttype,P.ID,P.vtype,P.name.c_str());
                        T->status |= (token::SORTED | token::IS_VALUE | token::DEFAULT_USED);
                        T->value = P.value;
                        t_head->next = T;
                        t_head = T;
                        break;
                    default:;
                    }
                }
            }
        }

        return VALID_COMMAND;
    }